

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O2

void __thiscall
TEST_MemoryLeakDetectorTest_freeOnlyTheMemoryInTheAllocationStage_TestShell::
TEST_MemoryLeakDetectorTest_freeOnlyTheMemoryInTheAllocationStage_TestShell
          (TEST_MemoryLeakDetectorTest_freeOnlyTheMemoryInTheAllocationStage_TestShell *this)

{
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell = (_func_int **)&PTR__ExecFunctionTestShell_00362520;
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, freeOnlyTheMemoryInTheAllocationStage)
{
    char* mem = detector->allocMemory(defaultMallocAllocator(), 2);
    detector->increaseAllocationStage();
    detector->allocMemory(defaultMallocAllocator(), 2);
    detector->deallocAllMemoryInCurrentAllocationStage();
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_all));
    detector->deallocMemory(defaultMallocAllocator(), mem);
}